

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O2

void Js::CrossSite::MarshalDynamicObject(ScriptContext *scriptContext,DynamicObject *object)

{
  Type TVar1;
  Type *pTVar2;
  HostScriptContext *pHVar3;
  JavascriptLibrary *this;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  JavascriptFunction *this_00;
  JavascriptProxy *this_01;
  RecyclableObject *aValue;
  JavascriptMethod p_Var9;
  
  BVar6 = RecyclableObject::IsExternal(&object->super_RecyclableObject);
  if ((BVar6 != 0) ||
     (iVar7 = (*(object->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(object), iVar7 != 0
     )) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x31,"(!object->IsExternal() && !object->IsCrossSiteObject())",
                                "!object->IsExternal() && !object->IsCrossSiteObject()");
    if (!bVar5) goto LAB_006c2135;
    *puVar8 = 0;
  }
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(object,scriptContext);
  pTVar2 = (object->super_RecyclableObject).type.ptr;
  TVar1 = pTVar2->typeId;
  if (TVar1 == TypeIds_Proxy) {
    this_01 = VarTo<Js::JavascriptProxy,Js::DynamicObject>(object);
    aValue = JavascriptProxy::GetTarget(this_01);
    bVar5 = JavascriptConversion::IsCallable(aValue);
    if (bVar5) {
      p_Var9 = RecyclableObject::GetEntryPoint(&object->super_RecyclableObject);
      if (p_Var9 != JavascriptProxy::FunctionCallTrap) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                    ,0x54,
                                    "(JavascriptProxy::FunctionCallTrap == object->GetEntryPoint())"
                                    ,"JavascriptProxy::FunctionCallTrap == object->GetEntryPoint()")
        ;
        if (!bVar5) goto LAB_006c2135;
        *puVar8 = 0;
      }
      ((object->super_RecyclableObject).type.ptr)->entryPoint = CrossSiteProxyCallTrap;
    }
  }
  else if (TVar1 == TypeIds_Function) {
    if ((((((((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
          super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
        defaultAccessorFunction.ptr == (JavascriptFunction *)object) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x38,
                                  "(object != object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction())"
                                  ,"default accessor marshalled");
      if (!bVar5) {
LAB_006c2135:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    this_00 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(object);
    pHVar3 = scriptContext->hostScriptContext;
    if ((pHVar3 != (HostScriptContext *)0x0) &&
       (iVar7 = (*pHVar3->_vptr_HostScriptContext[0x18])(pHVar3,this_00), (char)iVar7 != '\0')) {
      return;
    }
    pTVar2 = (this_00->super_DynamicObject).super_RecyclableObject.type.ptr;
    this = (pTVar2->javascriptLibrary).ptr;
    if (*(char *)&pTVar2[1].javascriptLibrary.ptr != '\x01') {
      JavascriptFunction::SetEntryPoint
                (this_00,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                         CurrentCrossSiteThunk);
      return;
    }
    JavascriptLibrary::SetCrossSiteForLockedFunctionType(this,this_00);
    return;
  }
  return;
}

Assistant:

void CrossSite::MarshalDynamicObject(ScriptContext * scriptContext, DynamicObject * object)
    {
        Assert(!object->IsExternal() && !object->IsCrossSiteObject());

        TTD_XSITE_LOG(scriptContext, "MarshalDynamicObject", object);

        object->MarshalToScriptContext(scriptContext);
        if (object->GetTypeId() == TypeIds_Function)
        {
            AssertMsg(object != object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction(), "default accessor marshalled");
            JavascriptFunction * function = VarTo<JavascriptFunction>(object);

            //TODO: this may be too aggressive and create x-site thunks that are't technically needed -- see uglify-2js test.

            // See if this function is one that the host needs to handle
            HostScriptContext * hostScriptContext = scriptContext->GetHostScriptContext();
            if (!hostScriptContext || !hostScriptContext->SetCrossSiteForFunctionType(function))
            {
                if (function->GetDynamicType()->GetIsLocked())
                {
                    TTD_XSITE_LOG(scriptContext, "SetCrossSiteForLockedFunctionType ", object);

                    function->GetLibrary()->SetCrossSiteForLockedFunctionType(function);
                }
                else
                {
                    TTD_XSITE_LOG(scriptContext, "setEntryPoint->CurrentCrossSiteThunk ", object);

                    function->SetEntryPoint(function->GetScriptContext()->CurrentCrossSiteThunk);
                }
            }
        }
        else if (object->GetTypeId() == TypeIds_Proxy)
        {
            RecyclableObject * target = VarTo<JavascriptProxy>(object)->GetTarget();
            if (JavascriptConversion::IsCallable(target))
            {
                Assert(JavascriptProxy::FunctionCallTrap == object->GetEntryPoint());
                TTD_XSITE_LOG(scriptContext, "setEntryPoint->CrossSiteProxyCallTrap ", object);
                object->GetDynamicType()->SetEntryPoint(CrossSite::CrossSiteProxyCallTrap);
            }
        }
    }